

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O0

void __thiscall cmCTestLaunch::LoadScrapeRules(cmCTestLaunch *this)

{
  cmCTestLaunch *this_local;
  
  if ((this->ScrapeRulesLoaded & 1U) == 0) {
    this->ScrapeRulesLoaded = true;
    std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
    emplace_back<char_const(&)[37]>
              ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
               &this->RegexWarning,(char (*) [37])"(^|[ :])[Ww][Aa][Rr][Nn][Ii][Nn][Gg]");
    std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
    emplace_back<char_const(&)[33]>
              ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
               &this->RegexWarning,(char (*) [33])"(^|[ :])[Rr][Ee][Mm][Aa][Rr][Kk]");
    std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
    emplace_back<char_const(&)[25]>
              ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
               &this->RegexWarning,(char (*) [25])"(^|[ :])[Nn][Oo][Tt][Ee]");
    LoadScrapeRules(this,"Warning",&this->RegexWarning);
    LoadScrapeRules(this,"WarningSuppress",&this->RegexWarningSuppress);
  }
  return;
}

Assistant:

void cmCTestLaunch::LoadScrapeRules()
{
  if (this->ScrapeRulesLoaded) {
    return;
  }
  this->ScrapeRulesLoaded = true;

  // Common compiler warning formats.  These are much simpler than the
  // full log-scraping expressions because we do not need to extract
  // file and line information.
  this->RegexWarning.emplace_back("(^|[ :])[Ww][Aa][Rr][Nn][Ii][Nn][Gg]");
  this->RegexWarning.emplace_back("(^|[ :])[Rr][Ee][Mm][Aa][Rr][Kk]");
  this->RegexWarning.emplace_back("(^|[ :])[Nn][Oo][Tt][Ee]");

  // Load custom match rules given to us by CTest.
  this->LoadScrapeRules("Warning", this->RegexWarning);
  this->LoadScrapeRules("WarningSuppress", this->RegexWarningSuppress);
}